

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex2-server.c
# Opt level: O2

void ssh2kex_coroutine(ssh2_transport_state *s,_Bool *aborted)

{
  BinarySink *pBVar1;
  ssh_key **ppsVar2;
  int iVar3;
  ssh_hash *psVar4;
  size_t sVar5;
  ssh_kex *kex;
  PacketLogSettings *pPVar6;
  uint *puVar7;
  LogContext *pLVar8;
  _Bool _Var9;
  uint uVar10;
  ProgressReceiverVtable *in_RAX;
  ulong uVar11;
  unsigned_long uVar12;
  ecdh_key *peVar13;
  PktIn *pPVar14;
  PrimeGenerationContext *pPVar15;
  PrimeCandidateSource *pPVar16;
  dh_ctx *pdVar17;
  PktOut *pPVar18;
  strbuf *psVar19;
  mp_int *pmVar20;
  RSAKey *pRVar21;
  ulong uVar22;
  Ssh *pSVar23;
  char *pcVar24;
  char *pcVar25;
  long lVar26;
  ptrlen pVar27;
  ProgressReceiver null_progress;
  
  iVar3 = s->crStateKex;
  null_progress.vt = in_RAX;
  if (iVar3 == 0x127) {
LAB_0012b4ca:
    pPVar14 = ssh2_transport_pop(s);
    if (pPVar14 == (PktIn *)0x0) {
      return;
    }
    uVar10 = pPVar14->type;
    if (uVar10 != 0x1f) {
      pSVar23 = (s->ppl).ssh;
      pPVar6 = ((s->ppl).bpp)->pls;
      pcVar24 = ssh2_pkt_type(pPVar6->kctx,pPVar6->actx,uVar10);
      pcVar25 = "Received unexpected packet when expecting RSA kex secret, type %d (%s)";
      goto LAB_0012b5eb;
    }
    pVar27 = BinarySource_get_string(pPVar14->binarysource_);
    BinarySink_put_stringpl(s->exhash->binarysink_,pVar27);
    pmVar20 = ssh_rsakex_decrypt(s->rsa_kex_key,s->kex_alg->hash,pVar27);
    if (pmVar20 != (mp_int *)0x0) {
      BinarySink_put_mp_ssh2(s->kex_shared_secret->binarysink_,pmVar20);
      mp_free(pmVar20);
      if (s->rsa_kex_key_needs_freeing == true) {
        ssh_rsakex_freekey(s->rsa_kex_key);
        safefree(s->rsa_kex_key);
      }
      s->rsa_kex_key = (RSAKey *)0x0;
      s->rsa_kex_key_needs_freeing = false;
      pPVar18 = (*((s->ppl).bpp)->vt->new_pktout)(0x20);
      psVar19 = finalise_and_sign_exhash(s);
      BinarySink_put_stringsb(pPVar18->binarysink_,psVar19);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar18->qnode);
      goto LAB_0012b5bc;
    }
    pSVar23 = (s->ppl).ssh;
    pcVar24 = "Unable to decrypt RSA kex secret";
  }
  else {
    if (iVar3 == 0x48) {
LAB_0012ac5d:
      pPVar14 = ssh2_transport_pop(s);
      if (pPVar14 == (PktIn *)0x0) {
        return;
      }
      uVar10 = pPVar14->type;
      if (uVar10 == 0x1e) {
        s->dh_got_size_bounds = false;
        lVar26 = 0x1fc;
      }
      else {
        if (uVar10 != 0x22) {
          pSVar23 = (s->ppl).ssh;
          pPVar6 = ((s->ppl).bpp)->pls;
          pcVar24 = ssh2_pkt_type(pPVar6->kctx,pPVar6->actx,uVar10);
          pcVar25 = 
          "Received unexpected packet when expecting Diffie-Hellman group exchange request, type %d (%s)"
          ;
          goto LAB_0012b5eb;
        }
        s->dh_got_size_bounds = true;
        uVar12 = BinarySource_get_uint32(pPVar14->binarysource_);
        s->dh_min_size = (int)uVar12;
        uVar12 = BinarySource_get_uint32(pPVar14->binarysource_);
        s->pbits = (int)uVar12;
        lVar26 = 0x154;
      }
      uVar12 = BinarySource_get_uint32(pPVar14->binarysource_);
      *(int *)((long)&s->crState + lVar26) = (int)uVar12;
      pPVar15 = probprime_new_context(&primegen_probabilistic);
      null_progress.vt = &null_progress_vt;
      pPVar16 = pcs_new(s->pbits);
      pmVar20 = (*pPVar15->vt->generate)(pPVar15,pPVar16,&null_progress);
      s->p = pmVar20;
      (*pPVar15->vt->free_context)(pPVar15);
      pmVar20 = mp_from_integer(2);
      s->g = pmVar20;
      pdVar17 = dh_setup_gex(s->p,pmVar20);
      s->dh_ctx = pdVar17;
      s->kex_init_value = 0x20;
      s->kex_reply_value = 0x21;
      pPVar18 = (*((s->ppl).bpp)->vt->new_pktout)(0x1f);
      BinarySink_put_mp_ssh2(pPVar18->binarysink_,s->p);
      BinarySink_put_mp_ssh2(pPVar18->binarysink_,s->g);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar18->qnode);
LAB_0012b0b2:
      pLVar8 = (s->ppl).logctx;
      pcVar24 = dupprintf("Doing Diffie-Hellman key exchange with hash %s",s->exhash->vt->text_name)
      ;
      logevent_and_free(pLVar8,pcVar24);
      pmVar20 = dh_create_e(s->dh_ctx);
      s->e = pmVar20;
      s->crStateKex = 0x88;
    }
    else if (iVar3 != 0x88) {
      if (iVar3 != 0xce) {
        if (iVar3 != 0) goto LAB_0012b5bc;
        uVar22 = 0;
        uVar11 = (ulong)(uint)s->nhostkeys;
        if (s->nhostkeys < 1) {
          uVar11 = uVar22;
        }
        do {
          if (uVar11 == uVar22) {
            if (s->hkey == (ssh_key *)0x0) {
              __assert_fail("s->hkey",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/kex2-server.c"
                            ,0x36,"void ssh2kex_coroutine(struct ssh2_transport_state *, _Bool *)");
            }
            goto LAB_0012ab9d;
          }
          ppsVar2 = s->hostkeys + uVar22;
          uVar22 = uVar22 + 1;
        } while ((*ppsVar2)->vt != s->hostkey_alg);
        s->hkey = *ppsVar2;
LAB_0012ab9d:
        strbuf_shrink_to(s->hostkeyblob,0);
        (*s->hkey->vt->public_blob)(s->hkey,s->hostkeyblob->binarysink_);
        psVar4 = s->exhash;
        psVar19 = s->hostkeyblob;
        sVar5 = psVar19->len;
        pVar27.ptr = psVar19->u;
        pVar27.len = psVar19->len;
        (s->hostkeydata).ptr = psVar19->u;
        (s->hostkeydata).len = sVar5;
        BinarySink_put_stringpl(psVar4->binarysink_,pVar27);
        kex = s->kex_alg;
        switch(kex->main_type) {
        case KEXTYPE_DH:
          _Var9 = dh_is_gex(kex);
          if (_Var9) {
            pLVar8 = (s->ppl).logctx;
            pcVar24 = dupprintf("Doing Diffie-Hellman group exchange");
            logevent_and_free(pLVar8,pcVar24);
            ((s->ppl).bpp)->pls->kctx = SSH2_PKTCTX_DHGEX;
            s->crStateKex = 0x48;
            goto LAB_0012ac5d;
          }
          ((s->ppl).bpp)->pls->kctx = SSH2_PKTCTX_DHGROUP;
          pdVar17 = dh_setup_group(s->kex_alg);
          s->dh_ctx = pdVar17;
          s->kex_init_value = 0x1e;
          s->kex_reply_value = 0x1f;
          pLVar8 = (s->ppl).logctx;
          pcVar24 = dupprintf("Using Diffie-Hellman with standard group \"%s\"",
                              s->kex_alg->groupname);
          logevent_and_free(pLVar8,pcVar24);
          goto LAB_0012b0b2;
        case KEXTYPE_RSA:
          pLVar8 = (s->ppl).logctx;
          pcVar24 = dupprintf("Doing RSA key exchange with hash %s",s->exhash->vt->text_name);
          logevent_and_free(pLVar8,pcVar24);
          ((s->ppl).bpp)->pls->kctx = SSH2_PKTCTX_RSAKEX;
          puVar7 = (uint *)s->kex_alg->extra;
          if ((s->ssc != (SshServerConfig *)0x0) &&
             (pRVar21 = s->ssc->rsa_kex_key, pRVar21 != (RSAKey *)0x0)) {
            uVar10 = ssh_rsakex_klen(pRVar21);
            pLVar8 = (s->ppl).logctx;
            if ((int)uVar10 < (int)*puVar7) {
              pcVar24 = dupprintf("Configured %d-bit RSA key is too short (min %d)",(ulong)uVar10);
              logevent_and_free(pLVar8,pcVar24);
            }
            else {
              pcVar24 = dupprintf("Using configured %d-bit RSA key",(ulong)uVar10);
              logevent_and_free(pLVar8,pcVar24);
              s->rsa_kex_key = s->ssc->rsa_kex_key;
            }
          }
          if (s->rsa_kex_key == (RSAKey *)0x0) {
            pLVar8 = (s->ppl).logctx;
            pcVar24 = dupprintf("Generating a %d-bit RSA key",(ulong)*puVar7);
            logevent_and_free(pLVar8,pcVar24);
            pRVar21 = (RSAKey *)safemalloc(1,0x48,0);
            s->rsa_kex_key = pRVar21;
            pPVar15 = probprime_new_context(&primegen_probabilistic);
            null_progress.vt = &null_progress_vt;
            rsa_generate(s->rsa_kex_key,*puVar7,false,pPVar15,&null_progress);
            (*pPVar15->vt->free_context)(pPVar15);
            s->rsa_kex_key->comment = (char *)0x0;
            s->rsa_kex_key_needs_freeing = true;
          }
          pPVar18 = (*((s->ppl).bpp)->vt->new_pktout)(0x1e);
          BinarySink_put_stringpl(pPVar18->binarysink_,s->hostkeydata);
          psVar19 = strbuf_new();
          (*((s->rsa_kex_key->sshk).vt)->public_blob)(&s->rsa_kex_key->sshk,psVar19->binarysink_);
          BinarySink_put_string(s->exhash->binarysink_,psVar19->u,psVar19->len);
          BinarySink_put_stringsb(pPVar18->binarysink_,psVar19);
          pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar18->qnode);
          s->crStateKex = 0x127;
          goto LAB_0012b4ca;
        case KEXTYPE_ECDH:
          pcVar24 = (*((kex->field_4).ecdh_vt)->description)(kex);
          pLVar8 = (s->ppl).logctx;
          pcVar25 = dupprintf("Doing %s, using hash %s",pcVar24,s->exhash->vt->text_name);
          logevent_and_free(pLVar8,pcVar25);
          safefree(pcVar24);
          peVar13 = (*((s->kex_alg->field_4).ecdh_vt)->new)(s->kex_alg,true);
          s->ecdh_key = peVar13;
          if (peVar13 == (ecdh_key *)0x0) {
            ssh_sw_abort((s->ppl).ssh,"Unable to generate key for ECDH");
            goto LAB_0012b611;
          }
          s->crStateKex = 0xce;
          break;
        case KEXTYPE_GSS:
          ssh_sw_abort((s->ppl).ssh,"GSS key exchange not supported in server");
          goto LAB_0012b5bc;
        default:
          __assert_fail("s->kex_alg->main_type == KEXTYPE_RSA",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/kex2-server.c"
                        ,0xf8,"void ssh2kex_coroutine(struct ssh2_transport_state *, _Bool *)");
        }
      }
      pPVar14 = ssh2_transport_pop(s);
      if (pPVar14 == (PktIn *)0x0) {
        return;
      }
      uVar10 = pPVar14->type;
      if (uVar10 != 0x1e) {
        pSVar23 = (s->ppl).ssh;
        pPVar6 = ((s->ppl).bpp)->pls;
        pcVar24 = ssh2_pkt_type(pPVar6->kctx,pPVar6->actx,uVar10);
        pcVar25 = "Received unexpected packet when expecting ECDH initial packet, type %d (%s)";
        goto LAB_0012b5eb;
      }
      pVar27 = BinarySource_get_string(pPVar14->binarysource_);
      BinarySink_put_stringpl(s->exhash->binarysink_,pVar27);
      _Var9 = (*s->ecdh_key->vt->getkey)(s->ecdh_key,pVar27,s->kex_shared_secret->binarysink_);
      if ((pPVar14->binarysource_[0].err != BSE_NO_ERROR) || (_Var9)) {
        pPVar18 = (*((s->ppl).bpp)->vt->new_pktout)(0x1f);
        pBVar1 = pPVar18->binarysink_;
        BinarySink_put_stringpl(pBVar1,s->hostkeydata);
        psVar19 = strbuf_new();
        (*s->ecdh_key->vt->getpublic)(s->ecdh_key,psVar19->binarysink_);
        BinarySink_put_string(s->exhash->binarysink_,psVar19->u,psVar19->len);
        BinarySink_put_stringsb(pBVar1,psVar19);
        psVar19 = finalise_and_sign_exhash(s);
        BinarySink_put_stringsb(pBVar1,psVar19);
        pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar18->qnode);
        (*s->ecdh_key->vt->free)(s->ecdh_key);
        s->ecdh_key = (ecdh_key *)0x0;
        goto LAB_0012b5bc;
      }
      pSVar23 = (s->ppl).ssh;
      pcVar24 = "Received invalid elliptic curve point in ECDH initial packet";
      goto LAB_0012b60a;
    }
    pPVar14 = ssh2_transport_pop(s);
    if (pPVar14 == (PktIn *)0x0) {
      return;
    }
    uVar10 = pPVar14->type;
    if (uVar10 != s->kex_init_value) {
      pSVar23 = (s->ppl).ssh;
      pPVar6 = ((s->ppl).bpp)->pls;
      pcVar24 = ssh2_pkt_type(pPVar6->kctx,pPVar6->actx,uVar10);
      pcVar25 = 
      "Received unexpected packet when expecting Diffie-Hellman initial packet, type %d (%s)";
LAB_0012b5eb:
      ssh_proto_error(pSVar23,pcVar25,(ulong)uVar10,pcVar24);
      goto LAB_0012b611;
    }
    pmVar20 = BinarySource_get_mp_ssh2(pPVar14->binarysource_);
    s->f = pmVar20;
    if (pPVar14->binarysource_[0].err == BSE_NO_ERROR) {
      pcVar24 = dh_validate_f(s->dh_ctx,pmVar20);
      if (pcVar24 == (char *)0x0) {
        pmVar20 = dh_find_K(s->dh_ctx,s->f);
        BinarySink_put_mp_ssh2(s->kex_shared_secret->binarysink_,pmVar20);
        mp_free(pmVar20);
        _Var9 = dh_is_gex(s->kex_alg);
        if (_Var9) {
          if (s->dh_got_size_bounds == true) {
            BinarySink_put_uint32(s->exhash->binarysink_,(long)s->dh_min_size);
          }
          BinarySink_put_uint32(s->exhash->binarysink_,(long)s->pbits);
          if (s->dh_got_size_bounds == true) {
            BinarySink_put_uint32(s->exhash->binarysink_,(long)s->dh_max_size);
          }
          BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->p);
          BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->g);
        }
        BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->f);
        BinarySink_put_mp_ssh2(s->exhash->binarysink_,s->e);
        pPVar18 = (*((s->ppl).bpp)->vt->new_pktout)(s->kex_reply_value);
        pBVar1 = pPVar18->binarysink_;
        BinarySink_put_stringpl(pBVar1,s->hostkeydata);
        BinarySink_put_mp_ssh2(pBVar1,s->e);
        psVar19 = finalise_and_sign_exhash(s);
        BinarySink_put_stringsb(pBVar1,psVar19);
        pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar18->qnode);
        dh_cleanup(s->dh_ctx);
        s->dh_ctx = (dh_ctx *)0x0;
        mp_free(s->f);
        s->f = (mp_int *)0x0;
        _Var9 = dh_is_gex(s->kex_alg);
        if (_Var9) {
          mp_free(s->g);
          s->g = (mp_int *)0x0;
          mp_free(s->p);
          s->p = (mp_int *)0x0;
        }
LAB_0012b5bc:
        s->crStateKex = 0;
        return;
      }
      ssh_proto_error((s->ppl).ssh,"Diffie-Hellman initial packet failed validation: %s",pcVar24);
      goto LAB_0012b611;
    }
    pSVar23 = (s->ppl).ssh;
    pcVar24 = "Unable to parse Diffie-Hellman initial packet";
  }
LAB_0012b60a:
  ssh_proto_error(pSVar23,pcVar24);
LAB_0012b611:
  *aborted = true;
  return;
}

Assistant:

void ssh2kex_coroutine(struct ssh2_transport_state *s, bool *aborted)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    PktIn *pktin;
    PktOut *pktout;

    crBegin(s->crStateKex);

    {
        int i;
        for (i = 0; i < s->nhostkeys; i++)
            if (ssh_key_alg(s->hostkeys[i]) == s->hostkey_alg) {
                s->hkey = s->hostkeys[i];
                break;
            }
        assert(s->hkey);
    }

    strbuf_clear(s->hostkeyblob);
    ssh_key_public_blob(s->hkey, BinarySink_UPCAST(s->hostkeyblob));
    s->hostkeydata = ptrlen_from_strbuf(s->hostkeyblob);

    put_stringpl(s->exhash, s->hostkeydata);

    if (s->kex_alg->main_type == KEXTYPE_DH) {
        /*
         * If we're doing Diffie-Hellman group exchange, start by
         * waiting for the group request.
         */
        if (dh_is_gex(s->kex_alg)) {
            ppl_logevent("Doing Diffie-Hellman group exchange");
            s->ppl.bpp->pls->kctx = SSH2_PKTCTX_DHGEX;

            crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
            if (pktin->type != SSH2_MSG_KEX_DH_GEX_REQUEST &&
                pktin->type != SSH2_MSG_KEX_DH_GEX_REQUEST_OLD) {
                ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                                "expecting Diffie-Hellman group exchange "
                                "request, type %d (%s)", pktin->type,
                                ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                              s->ppl.bpp->pls->actx,
                                              pktin->type));
                *aborted = true;
                return;
            }

            if (pktin->type != SSH2_MSG_KEX_DH_GEX_REQUEST_OLD) {
                s->dh_got_size_bounds = true;
                s->dh_min_size = get_uint32(pktin);
                s->pbits = get_uint32(pktin);
                s->dh_max_size = get_uint32(pktin);
            } else {
                s->dh_got_size_bounds = false;
                s->pbits = get_uint32(pktin);
            }

            /*
             * This is a hopeless strategy for making a secure DH
             * group! It's good enough for testing a client against,
             * but not for serious use.
             */
            PrimeGenerationContext *pgc = primegen_new_context(
                &primegen_probabilistic);
            ProgressReceiver null_progress;
            null_progress.vt = &null_progress_vt;
            s->p = primegen_generate(pgc, pcs_new(s->pbits), &null_progress);
            primegen_free_context(pgc);

            s->g = mp_from_integer(2);
            s->dh_ctx = dh_setup_gex(s->p, s->g);
            s->kex_init_value = SSH2_MSG_KEX_DH_GEX_INIT;
            s->kex_reply_value = SSH2_MSG_KEX_DH_GEX_REPLY;

            pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEX_DH_GEX_GROUP);
            put_mp_ssh2(pktout, s->p);
            put_mp_ssh2(pktout, s->g);
            pq_push(s->ppl.out_pq, pktout);
        } else {
            s->ppl.bpp->pls->kctx = SSH2_PKTCTX_DHGROUP;
            s->dh_ctx = dh_setup_group(s->kex_alg);
            s->kex_init_value = SSH2_MSG_KEXDH_INIT;
            s->kex_reply_value = SSH2_MSG_KEXDH_REPLY;
            ppl_logevent("Using Diffie-Hellman with standard group \"%s\"",
                         s->kex_alg->groupname);
        }

        ppl_logevent("Doing Diffie-Hellman key exchange with hash %s",
                     ssh_hash_alg(s->exhash)->text_name);

        /*
         * Generate e for Diffie-Hellman.
         */
        s->e = dh_create_e(s->dh_ctx);

        /*
         * Wait to receive f.
         */
        crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
        if (pktin->type != s->kex_init_value) {
            ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                            "expecting Diffie-Hellman initial packet, "
                            "type %d (%s)", pktin->type,
                            ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                          s->ppl.bpp->pls->actx,
                                          pktin->type));
            *aborted = true;
            return;
        }
        s->f = get_mp_ssh2(pktin);
        if (get_err(pktin)) {
            ssh_proto_error(s->ppl.ssh,
                            "Unable to parse Diffie-Hellman initial packet");
            *aborted = true;
            return;
        }

        {
            const char *err = dh_validate_f(s->dh_ctx, s->f);
            if (err) {
                ssh_proto_error(s->ppl.ssh, "Diffie-Hellman initial packet "
                                "failed validation: %s", err);
                *aborted = true;
                return;
            }
        }
        mp_int *K = dh_find_K(s->dh_ctx, s->f);
        put_mp_ssh2(s->kex_shared_secret, K);
        mp_free(K);

        if (dh_is_gex(s->kex_alg)) {
            if (s->dh_got_size_bounds)
                put_uint32(s->exhash, s->dh_min_size);
            put_uint32(s->exhash, s->pbits);
            if (s->dh_got_size_bounds)
                put_uint32(s->exhash, s->dh_max_size);
            put_mp_ssh2(s->exhash, s->p);
            put_mp_ssh2(s->exhash, s->g);
        }
        put_mp_ssh2(s->exhash, s->f);
        put_mp_ssh2(s->exhash, s->e);

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, s->kex_reply_value);
        put_stringpl(pktout, s->hostkeydata);
        put_mp_ssh2(pktout, s->e);
        put_stringsb(pktout, finalise_and_sign_exhash(s));
        pq_push(s->ppl.out_pq, pktout);

        dh_cleanup(s->dh_ctx);
        s->dh_ctx = NULL;
        mp_free(s->f); s->f = NULL;
        if (dh_is_gex(s->kex_alg)) {
            mp_free(s->g); s->g = NULL;
            mp_free(s->p); s->p = NULL;
        }
    } else if (s->kex_alg->main_type == KEXTYPE_ECDH) {
        char *desc = ecdh_keyalg_description(s->kex_alg);
        ppl_logevent("Doing %s, using hash %s", desc,
                     ssh_hash_alg(s->exhash)->text_name);
        sfree(desc);

        s->ecdh_key = ecdh_key_new(s->kex_alg, true);
        if (!s->ecdh_key) {
            ssh_sw_abort(s->ppl.ssh, "Unable to generate key for ECDH");
            *aborted = true;
            return;
        }

        crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
        if (pktin->type != SSH2_MSG_KEX_ECDH_INIT) {
            ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                            "expecting ECDH initial packet, type %d (%s)",
                            pktin->type,
                            ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                          s->ppl.bpp->pls->actx,
                                          pktin->type));
            *aborted = true;
            return;
        }

        {
            ptrlen keydata = get_string(pktin);
            put_stringpl(s->exhash, keydata);

            bool ok = ecdh_key_getkey(s->ecdh_key, keydata,
                                      BinarySink_UPCAST(s->kex_shared_secret));
            if (!get_err(pktin) && !ok) {
                ssh_proto_error(s->ppl.ssh, "Received invalid elliptic curve "
                                "point in ECDH initial packet");
                *aborted = true;
                return;
            }
        }

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEX_ECDH_REPLY);
        put_stringpl(pktout, s->hostkeydata);
        {
            strbuf *pubpoint = strbuf_new();
            ecdh_key_getpublic(s->ecdh_key, BinarySink_UPCAST(pubpoint));
            put_string(s->exhash, pubpoint->u, pubpoint->len);
            put_stringsb(pktout, pubpoint);
        }
        put_stringsb(pktout, finalise_and_sign_exhash(s));
        pq_push(s->ppl.out_pq, pktout);

        ecdh_key_free(s->ecdh_key);
        s->ecdh_key = NULL;
    } else if (s->kex_alg->main_type == KEXTYPE_GSS) {
        ssh_sw_abort(s->ppl.ssh, "GSS key exchange not supported in server");
    } else {
        assert(s->kex_alg->main_type == KEXTYPE_RSA);
        ppl_logevent("Doing RSA key exchange with hash %s",
                     ssh_hash_alg(s->exhash)->text_name);
        s->ppl.bpp->pls->kctx = SSH2_PKTCTX_RSAKEX;

        const struct ssh_rsa_kex_extra *extra =
            (const struct ssh_rsa_kex_extra *)s->kex_alg->extra;

        if (s->ssc && s->ssc->rsa_kex_key) {
            int klen = ssh_rsakex_klen(s->ssc->rsa_kex_key);
            if (klen >= extra->minklen) {
                ppl_logevent("Using configured %d-bit RSA key", klen);
                s->rsa_kex_key = s->ssc->rsa_kex_key;
            } else {
                ppl_logevent("Configured %d-bit RSA key is too short (min %d)",
                             klen, extra->minklen);
            }
        }

        if (!s->rsa_kex_key) {
            ppl_logevent("Generating a %d-bit RSA key", extra->minklen);

            s->rsa_kex_key = snew(RSAKey);

            PrimeGenerationContext *pgc = primegen_new_context(
                &primegen_probabilistic);
            ProgressReceiver null_progress;
            null_progress.vt = &null_progress_vt;
            rsa_generate(s->rsa_kex_key, extra->minklen, false,
                         pgc, &null_progress);
            primegen_free_context(pgc);

            s->rsa_kex_key->comment = NULL;
            s->rsa_kex_key_needs_freeing = true;
        }

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEXRSA_PUBKEY);
        put_stringpl(pktout, s->hostkeydata);
        {
            strbuf *pubblob = strbuf_new();
            ssh_key_public_blob(&s->rsa_kex_key->sshk,
                                BinarySink_UPCAST(pubblob));
            put_string(s->exhash, pubblob->u, pubblob->len);
            put_stringsb(pktout, pubblob);
        }
        pq_push(s->ppl.out_pq, pktout);

        crMaybeWaitUntilV((pktin = ssh2_transport_pop(s)) != NULL);
        if (pktin->type != SSH2_MSG_KEXRSA_SECRET) {
            ssh_proto_error(s->ppl.ssh, "Received unexpected packet when "
                            "expecting RSA kex secret, type %d (%s)",
                            pktin->type,
                            ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                          s->ppl.bpp->pls->actx,
                                          pktin->type));
            *aborted = true;
            return;
        }

        mp_int *K;
        {
            ptrlen encrypted_secret = get_string(pktin);
            put_stringpl(s->exhash, encrypted_secret);
            K = ssh_rsakex_decrypt(
                s->rsa_kex_key, s->kex_alg->hash, encrypted_secret);
        }

        if (!K) {
            ssh_proto_error(s->ppl.ssh, "Unable to decrypt RSA kex secret");
            *aborted = true;
            return;
        }

        put_mp_ssh2(s->kex_shared_secret, K);
        mp_free(K);

        if (s->rsa_kex_key_needs_freeing) {
            ssh_rsakex_freekey(s->rsa_kex_key);
            sfree(s->rsa_kex_key);
        }
        s->rsa_kex_key = NULL;
        s->rsa_kex_key_needs_freeing = false;

        pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH2_MSG_KEXRSA_DONE);
        put_stringsb(pktout, finalise_and_sign_exhash(s));
        pq_push(s->ppl.out_pq, pktout);
    }

    crFinishV;
}